

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool enchant2(object *obj,int16_t *score)

{
  _Bool _Var1;
  _Bool is_artifact;
  _Bool result;
  int16_t *score_local;
  object *obj_local;
  
  _Var1 = enchant_score(score,obj->artifact != (artifact *)0x0);
  return _Var1;
}

Assistant:

static bool enchant2(struct object *obj, int16_t *score)
{
	bool result = false;
	bool is_artifact = obj->artifact ? true : false;
	if (enchant_score(score, is_artifact)) result = true;
	return result;
}